

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_struct.h
# Opt level: O0

void __thiscall t_struct::t_struct(t_struct *this,t_program *program)

{
  t_program *program_local;
  t_struct *this_local;
  
  t_type::t_type(&this->super_t_type,program);
  (this->super_t_type).super_t_doc._vptr_t_doc = (_func_int **)&PTR__t_struct_00562d98;
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector(&this->members_);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector(&this->members_in_id_order_);
  this->is_xception_ = false;
  this->is_union_ = false;
  this->members_validated = false;
  this->members_with_value = 0;
  this->xsd_all_ = false;
  return;
}

Assistant:

t_struct(t_program* program)
    : t_type(program),
      is_xception_(false),
      is_union_(false),
      members_validated(false),
      members_with_value(0),
      xsd_all_(false) {}